

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

Quaternion ConvexDecomposition::operator*(Quaternion *a,Quaternion *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float4 fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Quaternion QVar11;
  
  fVar1 = (a->super_float4).x;
  auVar5._8_8_ = 0x400000000;
  auVar5._0_8_ = 0x400000000;
  fVar4 = b->super_float4;
  fVar2 = (a->super_float4).y;
  fVar3 = (a->super_float4).z;
  auVar9._0_4_ = -fVar1;
  auVar9._4_4_ = 0x80000000;
  auVar9._8_4_ = 0x80000000;
  auVar9._12_4_ = 0x80000000;
  auVar10._0_4_ = -fVar2;
  auVar10._4_4_ = 0x80000000;
  auVar10._8_4_ = 0x80000000;
  auVar10._12_4_ = 0x80000000;
  auVar7._0_4_ = -fVar3;
  auVar7._4_4_ = 0x80000000;
  auVar7._8_4_ = 0x80000000;
  auVar7._12_4_ = 0x80000000;
  auVar5 = vpermi2ps_avx512vl(auVar5,ZEXT416((uint)fVar1),auVar9);
  auVar6 = vshufps_avx((undefined1  [16])fVar4,(undefined1  [16])fVar4,0x1b);
  auVar9 = vshufps_avx(auVar10,ZEXT416((uint)fVar2),0);
  auVar8._0_4_ = auVar6._0_4_ * auVar5._0_4_;
  auVar8._4_4_ = auVar6._4_4_ * auVar5._4_4_;
  auVar8._8_4_ = auVar6._8_4_ * auVar5._8_4_;
  auVar8._12_4_ = auVar6._12_4_ * auVar5._12_4_;
  fVar1 = (a->super_float4).w;
  auVar6._4_4_ = fVar1;
  auVar6._0_4_ = fVar1;
  auVar6._8_4_ = fVar1;
  auVar6._12_4_ = fVar1;
  auVar6 = vfmadd231ps_avx512vl(auVar8,(undefined1  [16])fVar4,auVar6);
  auVar5 = vpermi2ps_avx512vl(_DAT_009f1190,auVar7,ZEXT416((uint)fVar3));
  auVar6 = vshufpd_avx(auVar6,auVar6,1);
  auVar6 = vfmadd213ps_fma(auVar9,(undefined1  [16])fVar4,auVar6);
  auVar6 = vshufps_avx(auVar6,auVar6,0x1b);
  auVar9 = vfmadd213ps_fma(auVar5,(undefined1  [16])fVar4,auVar6);
  auVar6 = vshufps_avx(auVar9,auVar9,0xe1);
  auVar9 = vshufps_avx(auVar9,auVar9,0xeb);
  QVar11.super_float4._0_8_ = auVar6._0_8_;
  QVar11.super_float4._8_8_ = auVar9._0_8_;
  return (Quaternion)QVar11.super_float4;
}

Assistant:

Quaternion operator*( const Quaternion& a, const Quaternion& b )
{
	Quaternion c;
	c.w = a.w*b.w - a.x*b.x - a.y*b.y - a.z*b.z;
	c.x = a.w*b.x + a.x*b.w + a.y*b.z - a.z*b.y; 
	c.y = a.w*b.y - a.x*b.z + a.y*b.w + a.z*b.x; 
	c.z = a.w*b.z + a.x*b.y - a.y*b.x + a.z*b.w; 
	return c;
}